

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::convert_flat_to_round_curves
          (SceneGraph *this,Ref<embree::SceneGraph::Node> *node)

{
  int iVar1;
  bool bVar2;
  undefined4 uVar3;
  long *plVar4;
  long *plVar5;
  long *plVar6;
  long lVar7;
  _func_int **pp_Var8;
  ulong uVar9;
  long local_68;
  long *local_60;
  Ref<embree::SceneGraph::Node> *local_58;
  Ref<embree::SceneGraph::Node> local_50;
  Ref<embree::SceneGraph::Node> local_48;
  Ref<embree::SceneGraph::Node> local_40;
  Node *local_38;
  
  if (node->ptr == (Node *)0x0) {
    plVar4 = (long *)0x0;
  }
  else {
    plVar4 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&TransformNode::typeinfo,0);
  }
  if (plVar4 != (long *)0x0) {
    (**(code **)(*plVar4 + 0x10))(plVar4);
    local_40.ptr = (Node *)plVar4[0x13];
    if (local_40.ptr != (Node *)0x0) {
      (*((local_40.ptr)->super_RefCount)._vptr_RefCount[2])();
    }
    convert_flat_to_round_curves((SceneGraph *)&local_68,&local_40);
    if ((long *)plVar4[0x13] != (long *)0x0) {
      (**(code **)(*(long *)plVar4[0x13] + 0x18))();
    }
    plVar4[0x13] = local_68;
    local_68 = 0;
    if (local_40.ptr != (Node *)0x0) {
      (*((local_40.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    bVar2 = true;
    goto LAB_00152e4d;
  }
  if (node->ptr == (Node *)0x0) {
    plVar5 = (long *)0x0;
  }
  else {
    plVar5 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&MultiTransformNode::typeinfo,0);
  }
  local_58 = node;
  if (plVar5 == (long *)0x0) {
    if (node->ptr == (Node *)0x0) {
      plVar6 = (long *)0x0;
    }
    else {
      plVar6 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&GroupNode::typeinfo,0);
    }
    local_60 = plVar5;
    local_38 = (Node *)this;
    if (plVar6 == (long *)0x0) {
      if (node->ptr == (Node *)0x0) {
        pp_Var8 = (_func_int **)0x0;
      }
      else {
        pp_Var8 = (_func_int **)__dynamic_cast(node->ptr,&Node::typeinfo,&HairSetNode::typeinfo,0);
      }
      if (pp_Var8 != (_func_int **)0x0) {
        (**(code **)(*pp_Var8 + 0x10))(pp_Var8);
        this = (SceneGraph *)local_38;
        node = local_58;
        plVar5 = local_60;
        iVar1 = *(int *)(pp_Var8 + 0xe);
        if (iVar1 == 0x11) {
          uVar3 = 0x10;
LAB_00152e13:
          *(undefined4 *)(pp_Var8 + 0xe) = uVar3;
        }
        else {
          if (iVar1 == 0x19) {
            uVar3 = 0x18;
            goto LAB_00152e13;
          }
          if (iVar1 == 0x21) {
            uVar3 = 0x20;
            goto LAB_00152e13;
          }
        }
        (local_38->super_RefCount)._vptr_RefCount = pp_Var8;
        (**(code **)(*pp_Var8 + 0x10))(pp_Var8);
        (**(code **)(*pp_Var8 + 0x18))(pp_Var8);
        if (plVar5 != (long *)0x0) {
          (**(code **)(*plVar5 + 0x18))(plVar5);
        }
        bVar2 = false;
        goto LAB_00152e4d;
      }
    }
    else {
      (**(code **)(*plVar6 + 0x10))(plVar6);
      lVar7 = plVar6[0xd];
      if (plVar6[0xe] != lVar7) {
        uVar9 = 0;
        do {
          local_50.ptr = *(Node **)(lVar7 + uVar9 * 8);
          if (local_50.ptr != (Node *)0x0) {
            (*((local_50.ptr)->super_RefCount)._vptr_RefCount[2])();
          }
          convert_flat_to_round_curves((SceneGraph *)&local_68,&local_50);
          lVar7 = plVar6[0xd];
          plVar5 = *(long **)(lVar7 + uVar9 * 8);
          if (plVar5 != (long *)0x0) {
            (**(code **)(*plVar5 + 0x18))();
          }
          *(long *)(lVar7 + uVar9 * 8) = local_68;
          local_68 = 0;
          if (local_50.ptr != (Node *)0x0) {
            (*((local_50.ptr)->super_RefCount)._vptr_RefCount[3])();
          }
          uVar9 = uVar9 + 1;
          lVar7 = plVar6[0xd];
        } while (uVar9 < (ulong)(plVar6[0xe] - lVar7 >> 3));
      }
    }
    this = (SceneGraph *)local_38;
    plVar5 = local_60;
    if (plVar6 != (long *)0x0) {
      (**(code **)(*plVar6 + 0x18))(plVar6);
    }
  }
  else {
    (**(code **)(*plVar5 + 0x10))(plVar5);
    local_48.ptr = (Node *)plVar5[0x10];
    if (local_48.ptr != (Node *)0x0) {
      (*((local_48.ptr)->super_RefCount)._vptr_RefCount[2])();
    }
    convert_flat_to_round_curves((SceneGraph *)&local_68,&local_48);
    if ((long *)plVar5[0x10] != (long *)0x0) {
      (**(code **)(*(long *)plVar5[0x10] + 0x18))();
    }
    plVar5[0x10] = local_68;
    local_68 = 0;
    if (local_48.ptr != (Node *)0x0) {
      (*((local_48.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
  }
  bVar2 = true;
  node = local_58;
  if (plVar5 != (long *)0x0) {
    (**(code **)(*plVar5 + 0x18))(plVar5);
    node = local_58;
  }
LAB_00152e4d:
  if (plVar4 != (long *)0x0) {
    (**(code **)(*plVar4 + 0x18))(plVar4);
  }
  if (bVar2) {
    (((Node *)this)->super_RefCount)._vptr_RefCount = (_func_int **)node->ptr;
    node->ptr = (Node *)0x0;
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::convert_flat_to_round_curves(Ref<SceneGraph::Node> node)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      xfmNode->child = convert_flat_to_round_curves(xfmNode->child);
    }
    else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
      xfmNode->child = convert_flat_to_round_curves(xfmNode->child);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        groupNode->children[i] = convert_flat_to_round_curves(groupNode->children[i]);
    }
    else if (Ref<SceneGraph::HairSetNode> hmesh = node.dynamicCast<SceneGraph::HairSetNode>()) 
    {
      if (hmesh->type == RTC_GEOMETRY_TYPE_FLAT_LINEAR_CURVE)
        hmesh->type = RTC_GEOMETRY_TYPE_ROUND_LINEAR_CURVE;
      else if (hmesh->type == RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE)
        hmesh->type = RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE;
      else if (hmesh->type == RTC_GEOMETRY_TYPE_FLAT_BSPLINE_CURVE)
        hmesh->type = RTC_GEOMETRY_TYPE_ROUND_BSPLINE_CURVE;

      return hmesh.dynamicCast<SceneGraph::Node>();
    }
    return node;
  }